

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86LEA(uchar *stream,x86Reg dst,uint labelID,int shift)

{
  uchar *stream_00;
  uint uVar1;
  UnsatisfiedJump local_28;
  
  local_28.labelID = labelID & 0x7fffffff;
  stream_00 = stream + 1;
  *stream = 0x8d;
  local_28.isNear = true;
  local_28.jmpPos = stream_00;
  FastVector<UnsatisfiedJump,_false,_false>::push_back(&pendingJumps,&local_28);
  uVar1 = encodeAddress(stream_00,rNONE,1,rNONE,-0x32323233,(int)regCode[dst]);
  return (uVar1 + (int)stream_00) - (int)stream;
}

Assistant:

int x86LEA(unsigned char *stream, x86Reg dst, unsigned int labelID, int shift)
{
	unsigned char *start = stream;

	labelID &= 0x7FFFFFFF;
	(void)shift;

	*stream++ = 0x8d;
	
	pendingJumps.push_back(UnsatisfiedJump(labelID, true, stream));
	stream += encodeAddress(stream, rNONE, 1, rNONE, 0xcdcdcdcd, regCode[dst]);

	return int(stream - start);
}